

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

bool __thiscall QCss::Parser::parseCombinator(Parser *this,Relation *relation)

{
  long lVar1;
  long lVar2;
  int iVar3;
  Relation RVar4;
  Symbol *pSVar5;
  long lVar6;
  
  *relation = NoRelation;
  iVar3 = this->index;
  lVar6 = (long)iVar3;
  lVar2 = lVar6 + -1;
  lVar1 = (this->symbols).d.size;
  if ((lVar2 < lVar1) && ((this->symbols).d.ptr[lVar2].token == S)) {
    *relation = MatchNextSelectorIfAncestor;
    lVar2 = lVar1 - lVar6;
    if (lVar2 != 0 && lVar6 <= lVar1) {
      pSVar5 = (this->symbols).d.ptr + lVar6;
      do {
        iVar3 = iVar3 + 1;
        if (pSVar5->token != S) break;
        this->index = iVar3;
        pSVar5 = pSVar5 + 1;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
  }
  else {
    this->index = (int)lVar2;
  }
  iVar3 = this->index;
  if ((lVar1 <= iVar3) ||
     (RVar4 = MatchNextSelectorIfDirectAdjecent, (this->symbols).d.ptr[iVar3].token != PLUS)) {
    iVar3 = this->index;
    if ((lVar1 <= iVar3) ||
       (RVar4 = MatchNextSelectorIfParent, (this->symbols).d.ptr[iVar3].token != GREATER)) {
      iVar3 = this->index;
      if ((lVar1 <= iVar3) ||
         (RVar4 = MatchNextSelectorIfIndirectAdjecent, (this->symbols).d.ptr[iVar3].token != TILDE))
      goto LAB_005f0aa3;
    }
  }
  this->index = iVar3 + 1;
  *relation = RVar4;
LAB_005f0aa3:
  iVar3 = this->index;
  lVar6 = (long)iVar3;
  lVar2 = lVar1 - lVar6;
  if (lVar2 != 0 && lVar6 <= lVar1) {
    pSVar5 = (this->symbols).d.ptr + lVar6;
    do {
      iVar3 = iVar3 + 1;
      if (pSVar5->token != S) {
        return true;
      }
      this->index = iVar3;
      pSVar5 = pSVar5 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return true;
}

Assistant:

bool Parser::parseCombinator(BasicSelector::Relation *relation)
{
    *relation = BasicSelector::NoRelation;
    if (lookup() == S) {
        *relation = BasicSelector::MatchNextSelectorIfAncestor;
        skipSpace();
    } else {
        prev();
    }
    if (test(PLUS)) {
        *relation = BasicSelector::MatchNextSelectorIfDirectAdjecent;
    } else if (test(GREATER)) {
        *relation = BasicSelector::MatchNextSelectorIfParent;
    } else if (test(TILDE)) {
        *relation = BasicSelector::MatchNextSelectorIfIndirectAdjecent;
    }
    skipSpace();
    return true;
}